

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O1

void tss_load_seg(CPUX86State *env,int seg_reg,int selector,int cpl,uintptr_t retaddr)

{
  uint32_t uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int exception_index;
  long lVar7;
  int cpl_1;
  abi_ptr addr;
  uint local_3c;
  
  uVar4 = selector & 0xfffc;
  if (uVar4 == 0) {
    if (1 < seg_reg - 1U) {
      return;
    }
    exception_index = 10;
    uVar4 = 0;
    goto LAB_005246a5;
  }
  uVar2 = 0x178;
  lVar7 = 0x148;
  if ((selector & 4U) == 0) {
    lVar7 = 0x178;
  }
  uVar3 = *(uint *)((long)env->regs + lVar7 + 0x10);
  if ((selector | 7U) <= uVar3) {
    uVar5 = 2;
    addr = (long)(int)(selector & 0xfffffff8) + *(long *)((long)env->regs + lVar7 + 8);
    if (((env->hflags >> 0x17 & 1) != 0) && (uVar5 = 0, (~env->hflags & 3) != 0)) {
      uVar5 = (uint)env->eflags >> 0x11 & 2;
    }
    local_3c = cpu_ldl_mmuidx_ra_x86_64(env,addr,uVar5,retaddr);
    uVar5 = 2;
    if (((env->hflags >> 0x17 & 1) != 0) && (uVar5 = 0, (~env->hflags & 3) != 0)) {
      uVar5 = (uint)env->eflags >> 0x11 & 2;
    }
    uVar1 = cpu_ldl_mmuidx_ra_x86_64(env,addr + 4,uVar5,retaddr);
    uVar2 = (ulong)uVar1;
  }
  if (((selector | 7U) <= uVar3) && (uVar3 = (uint)uVar2, (uVar3 >> 0xc & 1) != 0)) {
    uVar5 = (uint)(uVar2 >> 0xd) & 3;
    if (seg_reg == 2) {
      if (((uVar3 & 0xa00) == 0x200) && (uVar5 == cpl)) {
LAB_00524514:
        if (uVar5 == (selector & 3U)) {
LAB_00524550:
          if ((short)uVar2 < 0) {
            uVar6 = uVar3 & 0xf0000 | local_3c & 0xffff;
            uVar4 = uVar6 << 0xc | 0xfff;
            if ((uVar3 >> 0x17 & 1) == 0) {
              uVar4 = uVar6;
            }
            env->segs[seg_reg].selector = selector;
            env->segs[seg_reg].base =
                 (ulong)(uVar3 & 0xff000000 | local_3c >> 0x10 | (uVar3 & 0xff) << 0x10);
            env->segs[seg_reg].limit = uVar4;
            env->segs[seg_reg].flags = uVar3;
            if (seg_reg == 2) {
              env->hflags = env->hflags & 0xfffffffc | uVar5;
              cpu_sync_bndcs_hflags_x86_64(env);
            }
            else if (seg_reg == 1) {
              uVar4 = env->hflags;
              if ((uVar3 >> 0x15 & 1) == 0 || (uVar4 >> 0xe & 1) == 0) {
                uVar4 = uVar4 & 0xffff7fef | env->segs[1].flags >> 0x12 & 0x10;
              }
              else {
                uVar4 = uVar4 & 0xffff7f8f | 0x8030;
              }
              env->hflags = uVar4;
            }
            uVar4 = env->hflags;
            uVar3 = env->segs[2].flags >> 0x11 & 0x20;
            if (-1 < (short)uVar4) {
              if ((((env->cr[0] & 1) == 0) || ((uVar4 & 0x10) == 0)) ||
                 ((env->eflags & 0x20000) != 0)) {
                uVar3 = uVar3 | 0x40;
              }
              else {
                uVar3 = uVar3 | (uint)((env->segs[0].base != 0 || env->segs[3].base != 0) ||
                                      env->segs[2].base != 0) << 6;
              }
            }
            env->hflags = uVar4 & 0xffffff9f | uVar3;
            return;
          }
          exception_index = 0xb;
          goto LAB_005246a5;
        }
      }
    }
    else if (seg_reg == 1) {
      if ((uVar3 >> 0xb & 1) != 0) goto LAB_00524514;
    }
    else if (((uVar3 & 0xa00) != 0x800) &&
            (((~uVar3 & 0xc00) == 0 || ((cpl <= (int)uVar5 && ((selector & 3U) <= uVar5))))))
    goto LAB_00524550;
  }
  exception_index = 10;
LAB_005246a5:
  raise_exception_err_ra_x86_64(env,exception_index,uVar4,retaddr);
}

Assistant:

static void tss_load_seg(CPUX86State *env, int seg_reg, int selector, int cpl,
                         uintptr_t retaddr)
{
    uint32_t e1, e2;
    int rpl, dpl;

    if ((selector & 0xfffc) != 0) {
        if (load_segment_ra(env, &e1, &e2, selector, retaddr) != 0) {
            raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
        }
        if (!(e2 & DESC_S_MASK)) {
            raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
        }
        rpl = selector & 3;
        dpl = (e2 >> DESC_DPL_SHIFT) & 3;
        if (seg_reg == R_CS) {
            if (!(e2 & DESC_CS_MASK)) {
                raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
            }
            if (dpl != rpl) {
                raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
            }
        } else if (seg_reg == R_SS) {
            /* SS must be writable data */
            if ((e2 & DESC_CS_MASK) || !(e2 & DESC_W_MASK)) {
                raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
            }
            if (dpl != cpl || dpl != rpl) {
                raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
            }
        } else {
            /* not readable code */
            if ((e2 & DESC_CS_MASK) && !(e2 & DESC_R_MASK)) {
                raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
            }
            /* if data or non conforming code, checks the rights */
            if (((e2 >> DESC_TYPE_SHIFT) & 0xf) < 12) {
                if (dpl < cpl || dpl < rpl) {
                    raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
                }
            }
        }
        if (!(e2 & DESC_P_MASK)) {
            raise_exception_err_ra(env, EXCP0B_NOSEG, selector & 0xfffc, retaddr);
        }
        cpu_x86_load_seg_cache(env, seg_reg, selector,
                               get_seg_base(e1, e2),
                               get_seg_limit(e1, e2),
                               e2);
    } else {
        if (seg_reg == R_SS || seg_reg == R_CS) {
            raise_exception_err_ra(env, EXCP0A_TSS, selector & 0xfffc, retaddr);
        }
    }
}